

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O0

void slang::OS::printE(text_style *style,string_view text)

{
  FILE *this;
  size_t in_RCX;
  basic_string_view<char> bVar1;
  std_string_view<char> s;
  string_view text_00;
  FILE *local_40;
  char *local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  text_style *local_20;
  text_style *style_local;
  string_view text_local;
  
  this = _stderr;
  s._M_str = text._M_str;
  style_local = (text_style *)text._M_len;
  local_20 = style;
  text_local._M_len = (size_t)s._M_str;
  if (capturingOutput) {
    std::__cxx11::string::operator+=
              ((string *)&capturedStderr_abi_cxx11_,
               (basic_string_view<char,_std::char_traits<char>_> *)&style_local);
  }
  else if (showColorsStderr) {
    local_30 = sv("{}",2);
    ::fmt::v9::
    print<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_0>
              (this,style,&local_30,(basic_string_view<char,_std::char_traits<char>_> *)&style_local
              );
  }
  else {
    s._M_len = (size_t)s._M_str;
    bVar1 = ::fmt::v9::detail::to_string_view<char,_0>((detail *)style_local,s);
    local_40 = (FILE *)bVar1.data_;
    local_38 = (char *)bVar1.size_;
    text_00.size_ = in_RCX;
    text_00.data_ = local_38;
    ::fmt::v9::detail::print((detail *)this,local_40,text_00);
  }
  return;
}

Assistant:

void OS::printE(const fmt::text_style& style, string_view text) {
    if (capturingOutput)
        capturedStderr += text;
    else if (showColorsStderr)
        fmt::print(stderr, style, "{}"sv, text);
    else
        fmt::detail::print(stderr, fmt::detail::to_string_view(text));
}